

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffikyu(fitsfile *fptr,char *keyname,char *comm,int *status)

{
  int *in_RCX;
  char card [81];
  char valstring [71];
  char local_78 [80];
  int *local_28;
  int local_4;
  
  if (*in_RCX < 1) {
    local_28 = in_RCX;
    strcpy(local_78," ");
    ffmkky((char *)card._72_8_,(char *)card._64_8_,(char *)card._56_8_,(char *)card._48_8_,
           (int *)card._40_8_);
    ffikey((fitsfile *)card._40_8_,(char *)card._32_8_,(int *)card._24_8_);
    local_4 = *local_28;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffikyu(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           const char *comm,        /* I - keyword comment    */
           int *status)             /* IO - error status      */
/*
  Insert a null-valued keyword and comment into the FITS header.  
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    strcpy(valstring," ");  /* create a dummy value string */
    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffikey(fptr, card, status);

    return(*status);
}